

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  hash_exit_code_t exit_code;
  manifest_check_params manifest_check;
  hash_params params;
  manifest_check_params *in_stack_00000370;
  string *in_stack_00000378;
  hash_params *in_stack_00000808;
  hash_params *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char **in_stack_ffffffffffffff98;
  manifest_check_params in_stack_ffffffffffffffa4;
  byte local_33;
  hash_exit_code_t local_4;
  
  hash_params::hash_params(in_stack_ffffffffffffff70);
  manifest_check_params::manifest_check_params((manifest_check_params *)&stack0xffffffffffffffa4);
  hash_params_parse((int)in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                    (hash_params *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = manifest_type(in_stack_00000378,in_stack_00000370);
    if (!bVar1) {
      uVar3 = std::__cxx11::string::c_str();
      printf("ERROR cannot open manifest %s",uVar3);
      local_4 = HASH_EXIT_MANIFEST_FILE_ERROR;
      goto LAB_00103839;
    }
    if ((((((uint)in_stack_ffffffffffffffa4 & 0x10000) == 0) &&
         (((uint)in_stack_ffffffffffffffa4 & 0x100) == 0)) &&
        (((uint)in_stack_ffffffffffffffa4 & 1) == 0)) &&
       (((uint)in_stack_ffffffffffffffa4 & 0x1000000) == 0)) {
      uVar3 = std::__cxx11::string::c_str();
      printf("ERROR manifest does not have any known hash format in %s",uVar3);
      local_4 = HASH_EXIT_MANIFEST_UNKNOWN_HASH;
      goto LAB_00103839;
    }
    uVar3 = std::__cxx11::string::c_str();
    printf("manifest  %s",uVar3);
    if (((uint)in_stack_ffffffffffffffa4 & 0x10000) != 0) {
      printf("  sha256");
    }
    if (((uint)in_stack_ffffffffffffffa4 & 0x100) != 0) {
      printf("  sha1");
    }
    if (((uint)in_stack_ffffffffffffffa4 & 1) != 0) {
      printf("  xxh64");
    }
    if (((uint)in_stack_ffffffffffffffa4 & 0x1000000) != 0) {
      printf("  uuid");
    }
    printf("\n");
    local_33 = 1;
  }
  local_4 = gguf_hash(in_stack_00000808);
  if ((local_33 & 1) != 0) {
    uVar3 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffff70 = (hash_params *)hash_exit_code_to_str(local_4);
    printf("\nVerification results for %s - %s\n",uVar3,in_stack_ffffffffffffff70);
  }
LAB_00103839:
  hash_params::~hash_params(in_stack_ffffffffffffff70);
  return local_4;
}

Assistant:

int main(int argc, const char ** argv) {
    hash_params params;
    manifest_check_params manifest_check;
    hash_params_parse(argc, argv, params);

    if (!params.manifest_file.empty()) {
        if (!manifest_type(params.manifest_file, manifest_check)) {
            printf("ERROR cannot open manifest %s", params.manifest_file.c_str());
            return HASH_EXIT_MANIFEST_FILE_ERROR;
        }

        if (!manifest_check.sha256 && !manifest_check.sha1 && !manifest_check.xxh64 && !manifest_check.uuid) {
            printf("ERROR manifest does not have any known hash format in %s", params.manifest_file.c_str());
            return HASH_EXIT_MANIFEST_UNKNOWN_HASH;
        }

        printf("manifest  %s", params.manifest_file.c_str());

        if (manifest_check.sha256) {
            printf("  sha256");
        }

        if (manifest_check.sha1) {
            printf("  sha1");
        }

        if (manifest_check.xxh64) {
            printf("  xxh64");
        }

        if (manifest_check.uuid) {
            printf("  uuid");
        }

        printf("\n");

        // Autoselect the highest security hash if manifest is provided but
        // the user has not specifically defined the hash they care about
        if (!params.xxh64 && !params.sha1 && !params.uuid && !params.sha256) {
            // User has not selected a specific value, pick most secure hash
            if (manifest_check.sha256) {
                params.sha256 = true;
            } else if (manifest_check.sha1) {
                params.sha1 = true;
            } else if (manifest_check.xxh64) {
                params.xxh64 = true;
            } else if (manifest_check.uuid) {
                params.uuid = true;
            }
        }

        params.manifest_is_usable = true;
    }

    // By default if no swich argument provided, assume xxh64
    if (!params.xxh64 && !params.sha1 && !params.uuid && !params.sha256) {
        params.xxh64 = true;
    }

    hash_exit_code_t exit_code = gguf_hash(params);

    if (params.manifest_is_usable) {
        printf("\nVerification results for %s - %s\n", params.manifest_file.c_str(), hash_exit_code_to_str(exit_code));
    }

    return exit_code;
}